

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O1

char * fai_fetch(faidx_t *fai,char *str,int *len)

{
  khint_t kVar1;
  uint uVar2;
  kh_s_t *pkVar3;
  ushort *puVar4;
  khint32_t *pkVar5;
  faidx1_t *pfVar6;
  uint64_t uVar7;
  bool bVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  char *pcVar14;
  ushort **ppuVar15;
  byte bVar16;
  char *pcVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  khint_t kVar30;
  int iVar31;
  int iVar32;
  
  pkVar3 = fai->hash;
  sVar13 = strlen(str);
  uVar25 = (uint)sVar13;
  pcVar14 = (char *)malloc((long)(int)(uVar25 + 1));
  if ((int)uVar25 < 1) {
    uVar23 = 0;
  }
  else {
    ppuVar15 = __ctype_b_loc();
    puVar4 = *ppuVar15;
    uVar18 = 0;
    uVar23 = 0;
    do {
      if ((*(byte *)((long)puVar4 + (long)str[uVar18] * 2 + 1) & 0x20) == 0) {
        lVar22 = (long)(int)uVar23;
        uVar23 = uVar23 + 1;
        pcVar14[lVar22] = str[uVar18];
      }
      uVar18 = uVar18 + 1;
    } while ((uVar25 & 0x7fffffff) != uVar18);
  }
  pcVar14[(int)uVar23] = '\0';
  uVar18 = (ulong)uVar23;
  uVar29 = uVar23;
  do {
    uVar18 = uVar18 - 1;
    uVar20 = uVar25;
    if ((int)uVar29 < 1) break;
    uVar20 = uVar29 - 1;
    uVar29 = uVar20;
  } while (pcVar14[uVar18 & 0xffffffff] != ':');
  if ((int)uVar20 < (int)uVar23) {
    bVar8 = (int)(uVar20 + 1) < (int)uVar23;
    if ((int)(uVar20 + 1) < (int)uVar23) {
      lVar22 = (long)(int)uVar20 + 2;
      iVar32 = ~uVar20 + uVar23;
      iVar19 = 0;
      do {
        cVar9 = pcVar14[lVar22 + -1];
        if ((long)cVar9 == 0x2d) {
          iVar19 = iVar19 + 1;
        }
        else {
          ppuVar15 = __ctype_b_loc();
          if ((cVar9 != ',') && (((*ppuVar15)[cVar9] & 0x800) == 0)) break;
        }
        bVar8 = lVar22 < (int)uVar23;
        lVar22 = lVar22 + 1;
        iVar32 = iVar32 + -1;
      } while (iVar32 != 0);
      bVar8 = (bool)(bVar8 | 1 < iVar19);
    }
    if (bVar8) {
      uVar20 = uVar23;
    }
    pcVar14[(int)uVar20] = '\0';
    kVar1 = pkVar3->n_buckets;
    if (kVar1 == 0) {
      kVar30 = 0;
    }
    else {
      uVar25 = (uint)*pcVar14;
      if (*pcVar14 == '\0') {
        uVar25 = 0;
      }
      else {
        cVar9 = pcVar14[1];
        if (cVar9 != '\0') {
          pcVar17 = pcVar14 + 2;
          do {
            uVar25 = (int)cVar9 + uVar25 * 0x1f;
            cVar9 = *pcVar17;
            pcVar17 = pcVar17 + 1;
          } while (cVar9 != '\0');
        }
      }
      uVar25 = uVar25 & kVar1 - 1;
      pkVar5 = pkVar3->flags;
      iVar19 = 1;
      uVar29 = uVar25;
      do {
        uVar2 = pkVar5[uVar29 >> 4];
        if (((uVar2 & 2) != 0) ||
           (((uVar2 & 1) == 0 && (iVar32 = strcmp(pkVar3->keys[uVar29],pcVar14), iVar32 == 0)))) {
          kVar30 = uVar29;
          if ((uVar2 & 3) != 0) {
            kVar30 = kVar1;
          }
          break;
        }
        uVar29 = uVar29 + iVar19 & kVar1 - 1;
        iVar19 = iVar19 + 1;
        kVar30 = kVar1;
      } while (uVar29 != uVar25);
    }
    bVar8 = true;
    if (kVar30 == kVar1) {
      if (kVar1 == 0) {
        kVar30 = 0;
      }
      else {
        uVar25 = (uint)*str;
        if (*str == '\0') {
          uVar25 = 0;
        }
        else {
          cVar9 = str[1];
          if (cVar9 != '\0') {
            pcVar17 = str + 2;
            do {
              uVar25 = (int)cVar9 + uVar25 * 0x1f;
              cVar9 = *pcVar17;
              pcVar17 = pcVar17 + 1;
            } while (cVar9 != '\0');
          }
        }
        uVar25 = uVar25 & kVar1 - 1;
        pkVar5 = pkVar3->flags;
        iVar19 = 1;
        uVar29 = uVar25;
        do {
          uVar2 = pkVar5[uVar29 >> 4];
          if (((uVar2 & 2) != 0) ||
             (((uVar2 & 1) == 0 && (iVar32 = strcmp(pkVar3->keys[uVar29],str), iVar32 == 0)))) {
            kVar30 = uVar29;
            if ((uVar2 & 3) != 0) {
              kVar30 = kVar1;
            }
            break;
          }
          uVar29 = uVar29 + iVar19 & kVar1 - 1;
          iVar19 = iVar19 + 1;
          kVar30 = kVar1;
        } while (uVar29 != uVar25);
      }
      bVar8 = true;
      if (kVar30 == kVar1) {
        *len = 0;
        free(pcVar14);
        bVar8 = false;
      }
      else {
        pcVar14[(int)uVar20] = ':';
        uVar20 = uVar23;
      }
    }
    if (!bVar8) {
      return (char *)0x0;
    }
  }
  else {
    kVar30 = pkVar3->n_buckets;
    if (kVar30 == 0) {
      kVar30 = 0;
    }
    else {
      uVar25 = (uint)*str;
      if (*str == '\0') {
        uVar25 = 0;
      }
      else {
        cVar9 = str[1];
        if (cVar9 != '\0') {
          pcVar17 = str + 2;
          do {
            uVar25 = (int)cVar9 + uVar25 * 0x1f;
            cVar9 = *pcVar17;
            pcVar17 = pcVar17 + 1;
          } while (cVar9 != '\0');
        }
      }
      uVar25 = uVar25 & kVar30 - 1;
      pkVar5 = pkVar3->flags;
      iVar19 = 1;
      uVar29 = uVar25;
      do {
        uVar2 = pkVar5[uVar29 >> 4];
        bVar16 = (char)uVar29 * '\x02' & 0x1e;
        uVar10 = uVar2 >> bVar16;
        if (((uVar10 & 2) != 0) ||
           (((uVar10 & 1) == 0 && (iVar32 = strcmp(pkVar3->keys[uVar29],str), iVar32 == 0)))) {
          if ((uVar2 >> bVar16 & 3) == 0) {
            kVar30 = uVar29;
          }
          break;
        }
        uVar29 = uVar29 + iVar19 & kVar30 - 1;
        iVar19 = iVar19 + 1;
      } while (uVar29 != uVar25);
    }
  }
  if (kVar30 == pkVar3->n_buckets) {
    fprintf(_stderr,
            "[fai_fetch] Warning - Reference %s not found in FASTA file, returning empty sequence\n"
            ,str);
    free(pcVar14);
    *len = -2;
    return (char *)0x0;
  }
  pfVar6 = pkVar3->vals;
  iVar19 = pfVar6[kVar30].line_len;
  iVar32 = pfVar6[kVar30].line_blen;
  lVar22 = pfVar6[kVar30].len;
  uVar7 = pfVar6[kVar30].offset;
  iVar31 = (int)lVar22;
  iVar12 = iVar31;
  if ((int)uVar20 < (int)uVar23) {
    iVar26 = uVar20 + 1;
    iVar28 = iVar26;
    if (iVar26 < (int)uVar23) {
      lVar21 = 1;
      do {
        if (pcVar14[lVar21 + (int)uVar20] != ',') {
          lVar24 = (long)iVar28;
          iVar28 = iVar28 + 1;
          pcVar14[lVar24] = pcVar14[lVar21 + (int)uVar20];
        }
        lVar21 = lVar21 + 1;
      } while (uVar23 - uVar20 != (int)lVar21);
    }
    pcVar14[iVar28] = '\0';
    iVar11 = atoi(pcVar14 + (long)(int)uVar20 + 1);
    iVar27 = iVar26;
    if (iVar26 != iVar28) {
      pcVar17 = pcVar14 + iVar26;
      do {
        iVar27 = iVar26;
        if (*pcVar17 == '-') break;
        iVar26 = iVar26 + 1;
        pcVar17 = pcVar17 + 1;
        iVar27 = iVar28;
      } while (iVar28 != iVar26);
    }
    if (iVar27 < iVar28) {
      iVar12 = atoi(pcVar14 + (long)iVar27 + 1);
    }
    iVar11 = iVar11 - (uint)(0 < iVar11);
  }
  else {
    iVar11 = 0;
  }
  if (lVar22 <= iVar11) {
    iVar11 = iVar31;
  }
  if (lVar22 <= iVar12) {
    iVar12 = iVar31;
  }
  if (iVar12 <= iVar11) {
    iVar11 = iVar12;
  }
  free(pcVar14);
  iVar19 = bgzf_useek(fai->bgzf,
                      uVar7 + (long)(iVar11 % iVar32) + (long)(iVar11 / iVar32) * (long)iVar19,0);
  if (iVar19 < 0) {
    fai_fetch_cold_1();
    return (char *)0x0;
  }
  iVar12 = iVar12 - iVar11;
  pcVar14 = (char *)malloc((long)(iVar12 + 2));
  uVar25 = bgzf_getc(fai->bgzf);
  iVar19 = 0;
  if ((-1 < (int)uVar25) && (iVar19 = 0, 0 < iVar12)) {
    iVar19 = 0;
    ppuVar15 = __ctype_b_loc();
    do {
      if ((short)(*ppuVar15)[uVar25] < 0) {
        lVar22 = (long)iVar19;
        iVar19 = iVar19 + 1;
        pcVar14[lVar22] = (char)uVar25;
      }
      uVar25 = bgzf_getc(fai->bgzf);
    } while ((-1 < (int)uVar25) && (iVar19 < iVar12));
  }
  pcVar14[iVar19] = '\0';
  *len = iVar19;
  return pcVar14;
}

Assistant:

char *fai_fetch(const faidx_t *fai, const char *str, int *len)
{
    char *s;
    int c, i, l, k, name_end;
    khiter_t iter;
    faidx1_t val;
    khash_t(s) *h;
    int beg, end;

    beg = end = -1;
    h = fai->hash;
    name_end = l = strlen(str);
    s = (char*)malloc(l+1);
    // remove space
    for (i = k = 0; i < l; ++i)
        if (!isspace(str[i])) s[k++] = str[i];
    s[k] = 0; l = k;
    // determine the sequence name
    for (i = l - 1; i >= 0; --i) if (s[i] == ':') break; // look for colon from the end
    if (i >= 0) name_end = i;
    if (name_end < l) { // check if this is really the end
        int n_hyphen = 0;
        for (i = name_end + 1; i < l; ++i) {
            if (s[i] == '-') ++n_hyphen;
            else if (!isdigit(s[i]) && s[i] != ',') break;
        }
        if (i < l || n_hyphen > 1) name_end = l; // malformated region string; then take str as the name
        s[name_end] = 0;
        iter = kh_get(s, h, s);
        if (iter == kh_end(h)) { // cannot find the sequence name
            iter = kh_get(s, h, str); // try str as the name
            if (iter == kh_end(h)) {
                *len = 0;
            free(s); return 0;
            } else s[name_end] = ':', name_end = l;
        }
    } else iter = kh_get(s, h, str);
    if(iter == kh_end(h)) {
        fprintf(stderr, "[fai_fetch] Warning - Reference %s not found in FASTA file, returning empty sequence\n", str);
        free(s);
        *len = -2;
        return 0;
    };
    val = kh_value(h, iter);
    // parse the interval
    if (name_end < l) {
        for (i = k = name_end + 1; i < l; ++i)
            if (s[i] != ',') s[k++] = s[i];
        s[k] = 0;
        beg = atoi(s + name_end + 1);
        for (i = name_end + 1; i != k; ++i) if (s[i] == '-') break;
        end = i < k? atoi(s + i + 1) : val.len;
        if (beg > 0) --beg;
    } else beg = 0, end = val.len;
    if (beg >= val.len) beg = val.len;
    if (end >= val.len) end = val.len;
    if (beg > end) beg = end;
    free(s);

    // now retrieve the sequence
    int ret = bgzf_useek(fai->bgzf, val.offset + beg / val.line_blen * val.line_len + beg % val.line_blen, SEEK_SET);
    if ( ret<0 )
    {
        *len = -1;
        fprintf(stderr, "[fai_fetch] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n");
        return NULL;
    }
    l = 0;
    s = (char*)malloc(end - beg + 2);
    while ( (c=bgzf_getc(fai->bgzf))>=0 && l < end - beg )
        if (isgraph(c)) s[l++] = c;
    s[l] = '\0';
    *len = l;
    return s;
}